

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O0

void __thiscall
gmlc::networking::TcpServer::TcpServer
          (TcpServer *this,SocketFactory *sf,io_context *io_context,uint16_t portNum,
          int nominalBufferSize)

{
  undefined8 in_RDX;
  long in_RDI;
  SocketFactory *pSVar1;
  function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
  *this_00;
  tcp *__args;
  vector<asio::ip::basic_endpoint<asio::ip::tcp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>_>_>
  *this_01;
  int in_R8D;
  TcpServer *in_stack_000002a0;
  undefined1 __i;
  SocketFactory *in_stack_ffffffffffffff90;
  
  std::enable_shared_from_this<gmlc::networking::TcpServer>::enable_shared_from_this
            ((enable_shared_from_this<gmlc::networking::TcpServer> *)0x728c7f);
  *(undefined8 *)(in_RDI + 0x10) = in_RDX;
  pSVar1 = (SocketFactory *)(in_RDI + 0x18);
  SocketFactory::SocketFactory(in_stack_ffffffffffffff90,pSVar1);
  __i = (undefined1)((ulong)pSVar1 >> 0x38);
  std::mutex::mutex((mutex *)0x728cad);
  this_00 = (function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
             *)(in_RDI + 0x58);
  std::
  vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
  ::vector((vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
            *)0x728cc0);
  std::
  vector<asio::ip::basic_endpoint<asio::ip::tcp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>_>_>
  ::vector((vector<asio::ip::basic_endpoint<asio::ip::tcp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>_>_>
            *)0x728cd3);
  *(long *)(in_RDI + 0x88) = (long)in_R8D;
  __args = (tcp *)(in_RDI + 0x90);
  std::
  function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
  ::function(this_00);
  this_01 = (vector<asio::ip::basic_endpoint<asio::ip::tcp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>_>_>
             *)(in_RDI + 0xb0);
  std::function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>::
  function((function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
            *)this_00);
  std::
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)this_00);
  std::atomic<bool>::atomic((atomic<bool> *)this_00,(bool)__i);
  *(undefined1 *)(in_RDI + 0xf1) = 0;
  std::
  vector<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>
  ::vector((vector<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>
            *)0x728d51);
  asio::ip::tcp::v4();
  std::
  vector<asio::ip::basic_endpoint<asio::ip::tcp>,std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>>>
  ::emplace_back<asio::ip::tcp,unsigned_short&>(this_01,__args,(unsigned_short *)this_00);
  initialConnect(in_stack_000002a0);
  return;
}

Assistant:

TcpServer::TcpServer(
    const SocketFactory& sf,
    asio::io_context& io_context,
    uint16_t portNum,
    int nominalBufferSize) :
    ioctx(io_context), socket_factory(sf), bufferSize(nominalBufferSize)
{
    endpoints.emplace_back(asio::ip::tcp::v4(), portNum);
    initialConnect();
}